

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O2

shared_ptr<miniros::master::HostInfo> __thiscall
miniros::master::AddressResolver::updateHost(AddressResolver *this,RequesterInfo *requesterInfo)

{
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>>>
  *this_00;
  long lVar1;
  bool bVar2;
  Type TVar3;
  iterator iVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  pthread_mutex_t *__mutex;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>,_bool>
  pVar5;
  shared_ptr<miniros::master::HostInfo> sVar6;
  URL url;
  allocator<char> local_e1;
  pthread_mutex_t *local_e0;
  key_type local_d8;
  URL local_b8;
  
  lVar1._0_4_ = in_RDX._M_pi[2]._M_use_count;
  lVar1._4_4_ = in_RDX._M_pi[2]._M_weak_count;
  if (lVar1 == 0) {
    (this->m_hostname)._M_dataplus._M_p = (pointer)0x0;
    (this->m_hostname)._M_string_length = 0;
    goto LAB_0027ce92;
  }
  network::URL::URL(&local_b8);
  network::URL::fromString(&local_b8,(string *)(in_RDX._M_pi + 2),false);
  TVar3 = network::NetAddress::checkAddressType(&local_b8.host);
  bVar2 = network::NetAddress::isLocal((NetAddress *)(in_RDX._M_pi + 4));
  __mutex = (pthread_mutex_t *)&(requesterInfo->clientAddress).rawAddress;
  ::std::mutex::lock((mutex *)&__mutex->__data);
  if (TVar3 == AddressInvalid) {
    this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>>>
               *)((requesterInfo->callerApi).field_2._M_local_buf + 8);
    local_e0 = __mutex;
    iVar4 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>_>
                    *)this_00,&local_b8.host);
    if ((NetAddress *)iVar4._M_node == &requesterInfo->clientAddress) {
      ::std::make_shared<miniros::master::HostInfo,std::__cxx11::string&>(&local_d8);
      pVar5 = ::std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>>>
              ::_M_emplace_unique<std::__cxx11::string&,std::shared_ptr<miniros::master::HostInfo>>
                        (this_00,&local_b8.host,(shared_ptr<miniros::master::HostInfo> *)&local_d8);
      iVar4._M_node = (_Base_ptr)pVar5.first._M_node;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8._M_string_length);
    }
    if (bVar2) {
      *(undefined1 *)(*(long *)(iVar4._M_node + 2) + 0x50) = 1;
    }
    else {
      ::std::
      _Rb_tree<miniros::network::NetAddress,miniros::network::NetAddress,std::_Identity<miniros::network::NetAddress>,miniros::network::AddressCompare,std::allocator<miniros::network::NetAddress>>
      ::_M_insert_unique<miniros::network::NetAddress_const&>
                ((_Rb_tree<miniros::network::NetAddress,miniros::network::NetAddress,std::_Identity<miniros::network::NetAddress>,miniros::network::AddressCompare,std::allocator<miniros::network::NetAddress>>
                  *)(*(long *)(iVar4._M_node + 2) + 0x20),(NetAddress *)(in_RDX._M_pi + 4));
    }
    ::std::__shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2> *)
               (iVar4._M_node + 2));
    __mutex = local_e0;
  }
  else {
    if (bVar2) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"localhost",&local_e1);
      iVar4 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>_>
                      *)((long)&(requesterInfo->callerApi).field_2 + 8),&local_d8);
      ::std::__cxx11::string::~string((string *)&local_d8);
      if ((NetAddress *)iVar4._M_node != &requesterInfo->clientAddress) {
        ::std::__shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2> *)
                   (iVar4._M_node + 2));
        goto LAB_0027ce80;
      }
    }
    (this->m_hostname)._M_dataplus._M_p = (pointer)0x0;
    (this->m_hostname)._M_string_length = 0;
  }
LAB_0027ce80:
  pthread_mutex_unlock(__mutex);
  network::URL::~URL(&local_b8);
  in_RDX._M_pi = extraout_RDX;
LAB_0027ce92:
  sVar6.super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = in_RDX._M_pi;
  sVar6.super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<miniros::master::HostInfo>)
         sVar6.super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<HostInfo> AddressResolver::updateHost(const  RequesterInfo& requesterInfo)
{
  if (requesterInfo.callerApi.empty())
    return {};

  network::URL url;
  url.fromString(requesterInfo.callerApi, /*defaultPort*/false);

  // Host can contain either hostname or direct IP address.
  // We should try to make sure that m_hosts[host] points to the same object for both hostname and IP.

  // check if we got a direct IP address instead of a string hostname.
  bool isIP = network::NetAddress::checkAddressType(url.host) != network::NetAddress::AddressInvalid;
  bool isSameMachine = requesterInfo.clientAddress.isLocal();

  std::scoped_lock lock(m_mutex);

  if (isIP) {
    if (isSameMachine) {
      auto it = m_hosts.find("localhost");
      if (it != m_hosts.end())
        return it->second;
    }
    // TODO: find host which corresponds to client IP.
    return {};
  }

  auto it = m_hosts.find(url.host);
  if (it == m_hosts.end()) {
    // Avahi or similar DNS services can provide an alias for some host. Suppose we have some host="rpi.robot". Avahi
    // will provide DNS for "rpi.robot.local" hostname. Some users can force usage of Avahi hostname by specifying
    // ROS_HOSTNAME=rpi.robot.local. We should make sure this alias is points to the same HostInfo object.

    // In the same time, we should be ready that some hosts can have their DHCP ip addresses reassigned.
    // TODO: Check if this IP is already used.
    it = m_hosts.emplace(url.host, std::make_shared<HostInfo>(url.host)).first;
  }

  if (!isSameMachine)
    it->second->addresses.insert((requesterInfo.clientAddress));
  else
    it->second->local = true;

  return it->second;
}